

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::Extract<short,double>
          (Interpolator<false> *this,short *dest,Vector *result)

{
  short sVar1;
  bool bVar2;
  double dVar3;
  unkbyte10 Var4;
  double result_1;
  double local_48;
  string local_40;
  double local_20;
  
  sVar1 = *dest;
  if (this->CRN == this->FRN) {
    bVar2 = TryCast::Operation<short,double>(sVar1,&local_48,false);
    if (!bVar2) {
      Var4 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var4 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var4,&local_40);
      __cxa_throw((InvalidInputException *)Var4,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = TryCast::Operation<short,double>(sVar1,&local_48,false);
    if (!bVar2) {
      Var4 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var4 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var4,&local_40);
      __cxa_throw((InvalidInputException *)Var4,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_20 = local_48;
    sVar1 = dest[1];
    bVar2 = TryCast::Operation<short,double>(sVar1,&local_48,false);
    if (!bVar2) {
      Var4 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,double>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var4 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var4,&local_40);
      __cxa_throw((InvalidInputException *)Var4,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    dVar3 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_48 = dVar3 * local_48 + local_20 * (1.0 - dVar3);
  }
  return local_48;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}